

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarantool_tcp.c
# Opt level: O3

void call_helper(tnt_stream *tnt,char *func_name,char *format,...)

{
  char in_AL;
  tnt_request *req;
  tnt_stream *s;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list list;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  req = tnt_request_call((tnt_request *)0x0);
  s = tnt_object((tnt_stream *)0x0);
  list[0]._0_8_ = &stack0x00000008;
  local_48._0_4_ = 0x18;
  local_48._4_4_ = 0x30;
  list[0].overflow_arg_area = local_f8;
  tnt_object_vformat(s,format,(__va_list_tag *)local_48);
  tnt_request_set_funcz(req,"is_positive");
  tnt_request_set_tuple(req,s);
  tnt_request_compile(tnt,req);
  tnt_stream_free(s);
  tnt_request_free(req);
  return;
}

Assistant:

static void
call_helper(struct tnt_stream *tnt, const char *func_name,
	    const char *format, ...)
{
	struct tnt_request *request = tnt_request_call(NULL);
	struct tnt_stream *args = tnt_object(NULL);

	va_list list;
	va_start(list, format);
	tnt_object_vformat(args, format, list);
	va_end(list);

	tnt_request_set_funcz(request, func_name);
	tnt_request_set_tuple(request, args);
	tnt_request_compile(tnt, request);

	tnt_stream_free(args);
	tnt_request_free(request);
}